

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float *vertices;
  ulong *puVar27;
  byte bVar28;
  byte bVar29;
  uint uVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  Scene *pSVar39;
  byte bVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined4 uVar86;
  undefined1 auVar87 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_11b9;
  long local_11b8;
  RTCIntersectArguments *local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  RayQueryContext *local_1198;
  Scene *local_1190;
  Geometry *local_1188;
  int local_117c;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  long local_1158;
  long local_1150;
  long local_1148;
  long local_1140;
  RTCFilterFunctionNArguments local_1138;
  float local_1108;
  undefined4 local_1104;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 *local_1068;
  byte local_1060;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  ulong uVar34;
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    puVar27 = local_f68;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar49 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar116 = ZEXT1664(auVar49);
    auVar50 = vmaxss_avx512f(auVar49,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar101 = (ray->super_RayK<1>).tfar;
    auVar85 = ZEXT464((uint)fVar101);
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar51 = vandps_avx512vl((undefined1  [16])aVar3,auVar51);
    uStack_f70 = 0;
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    uVar48 = vcmpps_avx512vl(auVar51,auVar52,1);
    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = ZEXT1664(auVar51);
    auVar51 = vdivps_avx512vl(auVar51,(undefined1  [16])aVar3);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar7 = (bool)((byte)uVar48 & 1);
    auVar59._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
    bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
    auVar59._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
    bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
    auVar59._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
    bVar7 = (bool)((byte)(uVar48 >> 3) & 1);
    auVar59._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
    auVar53._8_4_ = 0x3f7ffffa;
    auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar53._12_4_ = 0x3f7ffffa;
    vmulps_avx512vl(auVar59,auVar53);
    auVar58._8_4_ = 0x3f800003;
    auVar58._0_8_ = 0x3f8000033f800003;
    auVar58._12_4_ = 0x3f800003;
    auVar52 = vmulps_avx512vl(auVar59,auVar58);
    local_10b8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar118 = ZEXT1664(local_10b8);
    local_10c8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar119 = ZEXT1664(local_10c8);
    local_10d8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar120 = ZEXT1664(local_10d8);
    auVar53 = vmaxss_avx512f(auVar49,ZEXT416((uint)fVar101));
    auVar51 = vucomiss_avx512f(auVar49);
    fVar88 = auVar51._0_4_;
    vmovshdup_avx(auVar51);
    local_fa8 = vshufps_avx(auVar51,auVar51,0x55);
    auVar106 = ZEXT1664(local_fa8);
    vshufpd_avx(auVar51,auVar51,1);
    local_fb8 = vshufps_avx(auVar51,auVar51,0xaa);
    auVar107 = ZEXT1664(local_fb8);
    fVar77 = auVar52._0_4_;
    local_fd8 = vshufps_avx(auVar52,auVar52,0x55);
    auVar111 = ZEXT1664(local_fd8);
    local_fe8 = vshufps_avx(auVar52,auVar52,0xaa);
    auVar113 = ZEXT1664(local_fe8);
    lVar32 = 0;
    vucomiss_avx512f(auVar49);
    lVar46 = 0x20;
    vucomiss_avx512f(auVar49);
    lVar41 = 0x40;
    uVar86 = auVar50._0_4_;
    local_ff8._4_4_ = uVar86;
    local_ff8._0_4_ = uVar86;
    local_ff8._8_4_ = uVar86;
    local_ff8._12_4_ = uVar86;
    auVar115 = ZEXT1664(local_ff8);
    uVar86 = auVar53._0_4_;
    auVar84 = ZEXT1664(CONCAT412(uVar86,CONCAT48(uVar86,CONCAT44(uVar86,uVar86))));
    local_11b8 = 0x40;
    local_1150 = 0;
    local_f98 = fVar88;
    fStack_f94 = fVar88;
    fStack_f90 = fVar88;
    fStack_f8c = fVar88;
    local_fc8 = fVar77;
    fStack_fc4 = fVar77;
    fStack_fc0 = fVar77;
    fStack_fbc = fVar77;
    local_1158 = 0x20;
    local_1198 = context;
    fVar110 = fVar77;
    fVar109 = fVar77;
    fVar108 = fVar77;
    fVar103 = fVar88;
    fVar102 = fVar88;
    fVar101 = fVar88;
LAB_01ea8412:
    do {
      pfVar1 = (float *)(puVar27 + -1);
      puVar27 = puVar27 + -2;
      if (*pfVar1 <= auVar85._0_4_) {
        uVar48 = *puVar27;
        while ((uVar48 & 8) == 0) {
          uVar31 = uVar48 & 0xfffffffffffffff0;
          uVar86 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar49._4_4_ = uVar86;
          auVar49._0_4_ = uVar86;
          auVar49._8_4_ = uVar86;
          auVar49._12_4_ = uVar86;
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + lVar32),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x20 + lVar32));
          auVar51 = vsubps_avx512vl(auVar51,auVar118._0_16_);
          auVar50._0_4_ = fVar101 * auVar51._0_4_;
          auVar50._4_4_ = fVar102 * auVar51._4_4_;
          auVar50._8_4_ = fVar103 * auVar51._8_4_;
          auVar50._12_4_ = fVar88 * auVar51._12_4_;
          auVar51 = vmaxps_avx(auVar115._0_16_,auVar50);
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + lVar46),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x20 + lVar46));
          auVar52 = vsubps_avx512vl(auVar52,auVar119._0_16_);
          auVar61._0_4_ = auVar106._0_4_ * auVar52._0_4_;
          auVar61._4_4_ = auVar106._4_4_ * auVar52._4_4_;
          auVar61._8_4_ = auVar106._8_4_ * auVar52._8_4_;
          auVar61._12_4_ = auVar106._12_4_ * auVar52._12_4_;
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + lVar41),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x20 + lVar41));
          auVar52 = vsubps_avx512vl(auVar52,auVar120._0_16_);
          auVar69._0_4_ = auVar107._0_4_ * auVar52._0_4_;
          auVar69._4_4_ = auVar107._4_4_ * auVar52._4_4_;
          auVar69._8_4_ = auVar107._8_4_ * auVar52._8_4_;
          auVar69._12_4_ = auVar107._12_4_ * auVar52._12_4_;
          auVar52 = vmaxps_avx(auVar61,auVar69);
          local_1098 = vmaxps_avx(auVar51,auVar52);
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x90),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x30));
          auVar51 = vsubps_avx512vl(auVar51,auVar118._0_16_);
          auVar71._0_4_ = fVar108 * auVar51._0_4_;
          auVar71._4_4_ = fVar109 * auVar51._4_4_;
          auVar71._8_4_ = fVar110 * auVar51._8_4_;
          auVar71._12_4_ = fVar77 * auVar51._12_4_;
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xb0),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x50));
          auVar51 = vsubps_avx512vl(auVar51,auVar119._0_16_);
          auVar70._0_4_ = auVar111._0_4_ * auVar51._0_4_;
          auVar70._4_4_ = auVar111._4_4_ * auVar51._4_4_;
          auVar70._8_4_ = auVar111._8_4_ * auVar51._8_4_;
          auVar70._12_4_ = auVar111._12_4_ * auVar51._12_4_;
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xd0),auVar49,
                                    *(undefined1 (*) [16])(uVar31 + 0x70));
          auVar51 = vsubps_avx512vl(auVar51,auVar120._0_16_);
          auVar60._0_4_ = auVar113._0_4_ * auVar51._0_4_;
          auVar60._4_4_ = auVar113._4_4_ * auVar51._4_4_;
          auVar60._8_4_ = auVar113._8_4_ * auVar51._8_4_;
          auVar60._12_4_ = auVar113._12_4_ * auVar51._12_4_;
          auVar51 = vminps_avx(auVar70,auVar60);
          auVar52 = vminps_avx(auVar84._0_16_,auVar71);
          auVar51 = vminps_avx(auVar52,auVar51);
          uVar15 = vcmpps_avx512vl(local_1098,auVar51,2);
          uVar33 = (uint)uVar15;
          if (((uint)uVar48 & 7) == 6) {
            uVar16 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
            uVar17 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(uVar31 + 0xe0),0xd);
            uVar33 = (uint)(byte)((byte)uVar16 & (byte)uVar17 & (byte)uVar15);
          }
          if ((byte)uVar33 == 0) {
            auVar51 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar85 = ZEXT1664(auVar51);
            if (puVar27 == &local_f78) {
              return;
            }
            goto LAB_01ea8412;
          }
          lVar18 = 0;
          for (uVar48 = (ulong)(byte)uVar33; (uVar48 & 1) == 0;
              uVar48 = uVar48 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar48 = *(ulong *)(uVar31 + lVar18 * 8);
          uVar33 = (uVar33 & 0xff) - 1 & uVar33 & 0xff;
          uVar34 = (ulong)uVar33;
          if (uVar33 != 0) {
            uVar44 = *(uint *)(local_1098 + lVar18 * 4);
            lVar41 = 0;
            for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              lVar41 = lVar41 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar35 = (ulong)uVar33;
            uVar34 = *(ulong *)(uVar31 + lVar41 * 8);
            uVar30 = *(uint *)(local_1098 + lVar41 * 4);
            lVar41 = local_11b8;
            if (uVar33 == 0) {
              if (uVar44 < uVar30) {
                *puVar27 = uVar34;
                *(uint *)(puVar27 + 1) = uVar30;
                puVar27 = puVar27 + 2;
              }
              else {
                *puVar27 = uVar48;
                *(uint *)(puVar27 + 1) = uVar44;
                puVar27 = puVar27 + 2;
                uVar48 = uVar34;
              }
            }
            else {
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar48;
              auVar51 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar44));
              auVar63._8_8_ = 0;
              auVar63._0_8_ = uVar34;
              auVar52 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar30));
              lVar18 = 0;
              for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar48 = (ulong)uVar33;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(uVar31 + lVar18 * 8);
              auVar50 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_1098 + lVar18 * 4)));
              auVar53 = vpshufd_avx(auVar51,0xaa);
              auVar58 = vpshufd_avx(auVar52,0xaa);
              auVar49 = vpshufd_avx(auVar50,0xaa);
              if (uVar33 == 0) {
                uVar48 = vpcmpgtd_avx512vl(auVar58,auVar53);
                uVar48 = uVar48 & 0xf;
                auVar58 = vpblendmd_avx512vl(auVar52,auVar51);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar54._0_4_ = (uint)bVar7 * auVar58._0_4_ | (uint)!bVar7 * auVar53._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar54._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar53._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar54._8_4_ = (uint)bVar7 * auVar58._8_4_ | (uint)!bVar7 * auVar53._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar54._12_4_ = (uint)bVar7 * auVar58._12_4_ | (uint)!bVar7 * auVar53._12_4_;
                auVar52 = vmovdqa32_avx512vl(auVar52);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar57._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar57._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
                auVar51 = vpshufd_avx(auVar54,0xaa);
                uVar31 = vpcmpgtd_avx512vl(auVar49,auVar51);
                uVar31 = uVar31 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar50,auVar54);
                bVar7 = (bool)((byte)uVar31 & 1);
                bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                uVar48 = CONCAT44((uint)bVar8 * auVar52._4_4_ | (uint)!bVar8 * auVar51._4_4_,
                                  (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_);
                auVar51 = vmovdqa32_avx512vl(auVar50);
                bVar7 = (bool)((byte)uVar31 & 1);
                auVar55._0_4_ = (uint)bVar7 * auVar51._0_4_ | !bVar7 * auVar54._0_4_;
                bVar7 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar7 * auVar51._4_4_ | !bVar7 * auVar54._4_4_;
                bVar7 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar7 * auVar51._8_4_ | !bVar7 * auVar54._8_4_;
                bVar7 = SUB81(uVar31 >> 3,0);
                auVar55._12_4_ = (uint)bVar7 * auVar51._12_4_ | !bVar7 * auVar54._12_4_;
                auVar51 = vpshufd_avx(auVar55,0xaa);
                auVar52 = vpshufd_avx(auVar57,0xaa);
                uVar31 = vpcmpgtd_avx512vl(auVar51,auVar52);
                uVar31 = uVar31 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar55,auVar57);
                bVar7 = (bool)((byte)uVar31 & 1);
                bVar9 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar13 = SUB81(uVar31 >> 3,0);
                auVar53 = vmovdqa32_avx512vl(auVar55);
                bVar8 = (bool)((byte)uVar31 & 1);
                bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar14 = SUB81(uVar31 >> 3,0);
                *(uint *)puVar27 = (uint)bVar8 * auVar53._0_4_ | !bVar8 * auVar57._0_4_;
                *(uint *)((long)puVar27 + 4) =
                     (uint)bVar10 * auVar53._4_4_ | !bVar10 * auVar57._4_4_;
                *(uint *)(puVar27 + 1) = (uint)bVar12 * auVar53._8_4_ | !bVar12 * auVar57._8_4_;
                *(uint *)((long)puVar27 + 0xc) =
                     (uint)bVar14 * auVar53._12_4_ | !bVar14 * auVar57._12_4_;
                *(uint *)(puVar27 + 2) = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
                *(uint *)((long)puVar27 + 0x14) =
                     (uint)bVar9 * auVar52._4_4_ | (uint)!bVar9 * auVar51._4_4_;
                *(uint *)(puVar27 + 3) =
                     (uint)bVar11 * auVar52._8_4_ | (uint)!bVar11 * auVar51._8_4_;
                *(uint *)((long)puVar27 + 0x1c) =
                     (uint)bVar13 * auVar52._12_4_ | (uint)!bVar13 * auVar51._12_4_;
                puVar27 = puVar27 + 4;
              }
              else {
                lVar18 = 0;
                for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                  lVar18 = lVar18 + 1;
                }
                uVar33 = *(uint *)(local_1098 + lVar18 * 4);
                auVar94._8_8_ = 0;
                auVar94._0_8_ = *(ulong *)(uVar31 + lVar18 * 8);
                auVar59 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar33));
                uVar48 = vpcmpgtd_avx512vl(auVar58,auVar53);
                uVar48 = uVar48 & 0xf;
                auVar58 = vpblendmd_avx512vl(auVar52,auVar51);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar64._0_4_ = (uint)bVar7 * auVar58._0_4_ | (uint)!bVar7 * auVar53._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar53._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar7 * auVar58._8_4_ | (uint)!bVar7 * auVar53._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar64._12_4_ = (uint)bVar7 * auVar58._12_4_ | (uint)!bVar7 * auVar53._12_4_;
                auVar52 = vmovdqa32_avx512vl(auVar52);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar65._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar65._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
                auVar89._4_4_ = uVar33;
                auVar89._0_4_ = uVar33;
                auVar89._8_4_ = uVar33;
                auVar89._12_4_ = uVar33;
                uVar48 = vpcmpgtd_avx512vl(auVar89,auVar49);
                uVar48 = uVar48 & 0xf;
                auVar51 = vpblendmd_avx512vl(auVar59,auVar50);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar67._0_4_ = (uint)bVar7 * auVar51._0_4_ | !bVar7 * uVar33;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar7 * auVar51._4_4_ | !bVar7 * uVar33;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar7 * auVar51._8_4_ | !bVar7 * uVar33;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar67._12_4_ = (uint)bVar7 * auVar51._12_4_ | !bVar7 * uVar33;
                auVar51 = vmovdqa32_avx512vl(auVar59);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar68._0_4_ = (uint)bVar7 * auVar51._0_4_ | (uint)!bVar7 * auVar50._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar7 * auVar51._4_4_ | (uint)!bVar7 * auVar50._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar7 * auVar51._8_4_ | (uint)!bVar7 * auVar50._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar68._12_4_ = (uint)bVar7 * auVar51._12_4_ | (uint)!bVar7 * auVar50._12_4_;
                auVar51 = vpshufd_avx(auVar68,0xaa);
                auVar52 = vpshufd_avx(auVar65,0xaa);
                uVar48 = vpcmpgtd_avx512vl(auVar51,auVar52);
                uVar48 = uVar48 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar68,auVar65);
                bVar7 = (bool)((byte)uVar48 & 1);
                auVar72._0_4_ = (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * auVar51._0_4_;
                bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * auVar51._4_4_;
                bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * auVar51._8_4_;
                bVar7 = SUB81(uVar48 >> 3,0);
                auVar72._12_4_ = (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * auVar51._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar68);
                bVar7 = (bool)((byte)uVar48 & 1);
                bVar9 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar12 = SUB81(uVar48 >> 3,0);
                auVar51 = vpshufd_avx(auVar67,0xaa);
                auVar52 = vpshufd_avx(auVar64,0xaa);
                uVar31 = vpcmpgtd_avx512vl(auVar51,auVar52);
                uVar31 = uVar31 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar67,auVar64);
                bVar8 = (bool)((byte)uVar31 & 1);
                bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
                uVar48 = CONCAT44((uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar51._4_4_,
                                  (uint)bVar8 * auVar52._0_4_ | (uint)!bVar8 * auVar51._0_4_);
                auVar51 = vmovdqa32_avx512vl(auVar67);
                bVar8 = (bool)((byte)uVar31 & 1);
                auVar73._0_4_ = (uint)bVar8 * auVar51._0_4_ | !bVar8 * auVar64._0_4_;
                bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar73._4_4_ = (uint)bVar8 * auVar51._4_4_ | !bVar8 * auVar64._4_4_;
                bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar73._8_4_ = (uint)bVar8 * auVar51._8_4_ | !bVar8 * auVar64._8_4_;
                bVar8 = SUB81(uVar31 >> 3,0);
                auVar73._12_4_ = (uint)bVar8 * auVar51._12_4_ | !bVar8 * auVar64._12_4_;
                auVar51 = vpshufd_avx(auVar73,0xaa);
                auVar52 = vpshufd_avx(auVar72,0xaa);
                uVar31 = vpcmpgtd_avx512vl(auVar52,auVar51);
                uVar31 = uVar31 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar72,auVar73);
                bVar8 = (bool)((byte)uVar31 & 1);
                auVar74._0_4_ = (uint)bVar8 * auVar52._0_4_ | (uint)!bVar8 * auVar51._0_4_;
                bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar74._4_4_ = (uint)bVar8 * auVar52._4_4_ | (uint)!bVar8 * auVar51._4_4_;
                bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar74._8_4_ = (uint)bVar8 * auVar52._8_4_ | (uint)!bVar8 * auVar51._8_4_;
                bVar8 = SUB81(uVar31 >> 3,0);
                auVar74._12_4_ = (uint)bVar8 * auVar52._12_4_ | (uint)!bVar8 * auVar51._12_4_;
                auVar51 = vmovdqa32_avx512vl(auVar72);
                bVar8 = (bool)((byte)uVar31 & 1);
                auVar56._0_4_ = (uint)bVar8 * auVar51._0_4_ | !bVar8 * auVar73._0_4_;
                bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar8 * auVar51._4_4_ | !bVar8 * auVar73._4_4_;
                bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar8 * auVar51._8_4_ | !bVar8 * auVar73._8_4_;
                bVar8 = SUB81(uVar31 >> 3,0);
                auVar56._12_4_ = (uint)bVar8 * auVar51._12_4_ | !bVar8 * auVar73._12_4_;
                *(uint *)puVar27 = (uint)bVar7 * auVar53._0_4_ | !bVar7 * auVar65._0_4_;
                *(uint *)((long)puVar27 + 4) = (uint)bVar9 * auVar53._4_4_ | !bVar9 * auVar65._4_4_;
                *(uint *)(puVar27 + 1) = (uint)bVar11 * auVar53._8_4_ | !bVar11 * auVar65._8_4_;
                *(uint *)((long)puVar27 + 0xc) =
                     (uint)bVar12 * auVar53._12_4_ | !bVar12 * auVar65._12_4_;
                *(undefined1 (*) [16])(puVar27 + 2) = auVar56;
                *(undefined1 (*) [16])(puVar27 + 4) = auVar74;
                puVar27 = puVar27 + 6;
              }
            }
          }
        }
        local_1148 = (ulong)((uint)uVar48 & 0xf) - 8;
        if (local_1148 != 0) {
          uVar48 = uVar48 & 0xfffffffffffffff0;
          pSVar39 = context->scene;
          local_1140 = 0;
          local_1190 = pSVar39;
          do {
            lVar46 = local_1140 * 0x50;
            pGVar6 = (pSVar39->geometries).items[*(uint *)(uVar48 + 0x30 + lVar46)].ptr;
            fVar101 = (pGVar6->time_range).lower;
            fVar101 = pGVar6->fnumTimeSegments *
                      (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar101) /
                      ((pGVar6->time_range).upper - fVar101));
            auVar51 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
            auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar57 = vmaxss_avx512f(auVar116._0_16_,auVar51);
            lVar32 = (long)(int)auVar57._0_4_ * 0x38;
            uVar37 = (ulong)*(uint *)(uVar48 + 4 + lVar46);
            lVar41 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar32);
            lVar32 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar32);
            auVar51 = *(undefined1 (*) [16])(lVar41 + (ulong)*(uint *)(uVar48 + lVar46) * 4);
            uVar31 = CONCAT44(0,*(uint *)(uVar48 + 0x10 + lVar46));
            local_1168._0_8_ = uVar31;
            auVar52 = *(undefined1 (*) [16])(lVar41 + uVar31 * 4);
            local_11a0 = (ulong)*(uint *)(uVar48 + 0x20 + lVar46);
            auVar53 = *(undefined1 (*) [16])(lVar41 + local_11a0 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar41 + uVar37 * 4);
            uVar34 = CONCAT44(0,*(uint *)(uVar48 + 0x14 + lVar46));
            local_1178._0_8_ = uVar34;
            auVar49 = *(undefined1 (*) [16])(lVar41 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar48 + 0x24 + lVar46);
            auVar50 = *(undefined1 (*) [16])(lVar41 + uVar35 * 4);
            uVar47 = (ulong)*(uint *)(uVar48 + 8 + lVar46);
            auVar59 = *(undefined1 (*) [16])(lVar41 + uVar47 * 4);
            uVar45 = (ulong)*(uint *)(uVar48 + 0x18 + lVar46);
            auVar61 = *(undefined1 (*) [16])(lVar41 + uVar45 * 4);
            uVar43 = (ulong)*(uint *)(uVar48 + 0x28 + lVar46);
            auVar71 = *(undefined1 (*) [16])(lVar41 + uVar43 * 4);
            uVar42 = (ulong)*(uint *)(uVar48 + 0xc + lVar46);
            auVar69 = *(undefined1 (*) [16])(lVar41 + uVar42 * 4);
            uVar38 = (ulong)*(uint *)(uVar48 + 0x1c + lVar46);
            auVar70 = *(undefined1 (*) [16])(lVar41 + uVar38 * 4);
            uVar36 = (ulong)*(uint *)(uVar48 + 0x2c + lVar46);
            auVar60 = *(undefined1 (*) [16])(lVar41 + uVar36 * 4);
            auVar62 = *(undefined1 (*) [16])(lVar32 + (ulong)*(uint *)(uVar48 + lVar46) * 4);
            auVar63 = *(undefined1 (*) [16])(lVar32 + uVar31 * 4);
            auVar66 = *(undefined1 (*) [16])(lVar32 + local_11a0 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar32 + uVar37 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar32 + uVar34 * 4);
            auVar67 = *(undefined1 (*) [16])(lVar32 + uVar35 * 4);
            auVar68 = *(undefined1 (*) [16])(lVar32 + uVar47 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar32 + uVar45 * 4);
            auVar73 = *(undefined1 (*) [16])(lVar32 + uVar43 * 4);
            auVar74 = *(undefined1 (*) [16])(lVar32 + uVar42 * 4);
            auVar56 = *(undefined1 (*) [16])(lVar32 + uVar38 * 4);
            auVar89 = *(undefined1 (*) [16])(lVar32 + uVar36 * 4);
            puVar2 = (undefined8 *)(uVar48 + 0x30 + lVar46);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(uVar48 + 0x40 + lVar46);
            auVar94 = vunpcklps_avx(auVar51,auVar59);
            auVar51 = vunpckhps_avx(auVar51,auVar59);
            auVar59 = vunpcklps_avx(auVar58,auVar69);
            auVar58 = vunpckhps_avx(auVar58,auVar69);
            auVar69 = vunpcklps_avx(auVar51,auVar58);
            auVar54 = vunpcklps_avx(auVar94,auVar59);
            auVar51 = vunpckhps_avx(auVar94,auVar59);
            auVar59 = vunpcklps_avx(auVar52,auVar61);
            auVar52 = vunpckhps_avx(auVar52,auVar61);
            auVar61 = vunpcklps_avx(auVar49,auVar70);
            auVar58 = vunpckhps_avx(auVar49,auVar70);
            auVar49 = vunpcklps_avx(auVar52,auVar58);
            auVar70 = vunpcklps_avx(auVar59,auVar61);
            auVar52 = vunpckhps_avx(auVar59,auVar61);
            auVar59 = vunpcklps_avx(auVar53,auVar71);
            auVar53 = vunpckhps_avx(auVar53,auVar71);
            auVar61 = vunpcklps_avx(auVar50,auVar60);
            auVar58 = vunpckhps_avx(auVar50,auVar60);
            auVar50 = vunpcklps_avx(auVar53,auVar58);
            auVar71 = vunpcklps_avx(auVar59,auVar61);
            auVar53 = vunpckhps_avx(auVar59,auVar61);
            auVar58 = vunpcklps_avx512vl(auVar62,auVar68);
            auVar59 = vunpckhps_avx512vl(auVar62,auVar68);
            auVar60 = vunpcklps_avx512vl(auVar64,auVar74);
            auVar61 = vunpckhps_avx512vl(auVar64,auVar74);
            auVar59 = vunpcklps_avx(auVar59,auVar61);
            auVar61 = vunpcklps_avx(auVar58,auVar60);
            auVar58 = vunpckhps_avx(auVar58,auVar60);
            auVar60 = vunpcklps_avx512vl(auVar63,auVar72);
            auVar62 = vunpckhps_avx512vl(auVar63,auVar72);
            auVar63 = vunpcklps_avx512vl(auVar65,auVar56);
            auVar64 = vunpckhps_avx512vl(auVar65,auVar56);
            auVar62 = vunpcklps_avx512vl(auVar62,auVar64);
            auVar64 = vunpcklps_avx512vl(auVar60,auVar63);
            auVar63 = vunpckhps_avx512vl(auVar60,auVar63);
            auVar65 = vunpcklps_avx512vl(auVar66,auVar73);
            auVar60 = vunpckhps_avx512vl(auVar66,auVar73);
            auVar66 = vunpcklps_avx512vl(auVar67,auVar89);
            auVar67 = vunpckhps_avx512vl(auVar67,auVar89);
            auVar60 = vunpcklps_avx(auVar60,auVar67);
            auVar67 = vunpcklps_avx512vl(auVar65,auVar66);
            auVar66 = vunpckhps_avx512vl(auVar65,auVar66);
            auVar68 = ZEXT416((uint)(fVar101 - auVar57._0_4_));
            auVar65 = vbroadcastss_avx512vl(auVar68);
            auVar68 = vsubss_avx512f(ZEXT416(0x3f800000),auVar68);
            auVar78._0_4_ = auVar68._0_4_;
            auVar78._4_4_ = auVar78._0_4_;
            auVar78._8_4_ = auVar78._0_4_;
            auVar78._12_4_ = auVar78._0_4_;
            auVar61 = vmulps_avx512vl(auVar65,auVar61);
            auVar68 = vmulps_avx512vl(auVar65,auVar58);
            auVar59 = vmulps_avx512vl(auVar65,auVar59);
            auVar58 = vfmadd231ps_fma(auVar61,auVar78,auVar54);
            auVar68 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar51);
            auVar59 = vfmadd231ps_fma(auVar59,auVar78,auVar69);
            auVar51 = vmulps_avx512vl(auVar65,auVar64);
            auVar69 = vmulps_avx512vl(auVar65,auVar63);
            auVar62 = vmulps_avx512vl(auVar65,auVar62);
            auVar61 = vfmadd231ps_fma(auVar51,auVar78,auVar70);
            auVar69 = vfmadd231ps_fma(auVar69,auVar78,auVar52);
            auVar70 = vfmadd231ps_avx512vl(auVar62,auVar78,auVar49);
            auVar51 = vmulps_avx512vl(auVar65,auVar67);
            auVar52 = vmulps_avx512vl(auVar65,auVar66);
            auVar60 = vmulps_avx512vl(auVar65,auVar60);
            auVar49 = vfmadd231ps_fma(auVar51,auVar78,auVar71);
            auVar71 = vfmadd231ps_fma(auVar52,auVar78,auVar53);
            auVar50 = vfmadd231ps_fma(auVar60,auVar78,auVar50);
            local_10a8 = *puVar2;
            uStack_10a0 = puVar2[1];
            uVar86 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar79._4_4_ = uVar86;
            auVar79._0_4_ = uVar86;
            auVar79._8_4_ = uVar86;
            auVar79._12_4_ = uVar86;
            uVar86 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar87._4_4_ = uVar86;
            auVar87._0_4_ = uVar86;
            auVar87._8_4_ = uVar86;
            auVar87._12_4_ = uVar86;
            uVar86 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar97._4_4_ = uVar86;
            auVar97._0_4_ = uVar86;
            auVar97._8_4_ = uVar86;
            auVar97._12_4_ = uVar86;
            uVar86 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar92._4_4_ = uVar86;
            auVar92._0_4_ = uVar86;
            auVar92._8_4_ = uVar86;
            auVar92._12_4_ = uVar86;
            uVar86 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar95._4_4_ = uVar86;
            auVar95._0_4_ = uVar86;
            auVar95._8_4_ = uVar86;
            auVar95._12_4_ = uVar86;
            local_11b9 = 0;
            fVar101 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar104._4_4_ = fVar101;
            auVar104._0_4_ = fVar101;
            auVar104._8_4_ = fVar101;
            auVar104._12_4_ = fVar101;
            auVar51 = vsubps_avx(auVar58,auVar79);
            auVar60 = vsubps_avx512vl(auVar68,auVar87);
            auVar52 = vsubps_avx(auVar59,auVar97);
            auVar53 = vsubps_avx(auVar61,auVar79);
            auVar59 = vsubps_avx512vl(auVar69,auVar87);
            auVar61 = vsubps_avx512vl(auVar70,auVar97);
            auVar69 = vsubps_avx512vl(auVar49,auVar79);
            auVar58 = vsubps_avx(auVar71,auVar87);
            auVar71 = vsubps_avx512vl(auVar50,auVar97);
            auVar70 = vsubps_avx512vl(auVar69,auVar51);
            auVar49 = vsubps_avx(auVar58,auVar60);
            auVar62 = vsubps_avx512vl(auVar71,auVar52);
            auVar63 = vsubps_avx512vl(auVar51,auVar53);
            auVar66 = vsubps_avx512vl(auVar60,auVar59);
            auVar64 = vsubps_avx512vl(auVar52,auVar61);
            auVar65 = vsubps_avx512vl(auVar53,auVar69);
            auVar67 = vsubps_avx512vl(auVar59,auVar58);
            auVar68 = vsubps_avx512vl(auVar61,auVar71);
            auVar50 = vaddps_avx512vl(auVar69,auVar51);
            auVar98._0_4_ = auVar58._0_4_ + auVar60._0_4_;
            auVar98._4_4_ = auVar58._4_4_ + auVar60._4_4_;
            auVar98._8_4_ = auVar58._8_4_ + auVar60._8_4_;
            auVar98._12_4_ = auVar58._12_4_ + auVar60._12_4_;
            auVar72 = vaddps_avx512vl(auVar71,auVar52);
            auVar73 = vmulps_avx512vl(auVar98,auVar62);
            auVar73 = vfmsub231ps_avx512vl(auVar73,auVar49,auVar72);
            auVar72 = vmulps_avx512vl(auVar72,auVar70);
            auVar72 = vfmsub231ps_avx512vl(auVar72,auVar62,auVar50);
            auVar90._0_4_ = auVar49._0_4_ * auVar50._0_4_;
            auVar90._4_4_ = auVar49._4_4_ * auVar50._4_4_;
            auVar90._8_4_ = auVar49._8_4_ * auVar50._8_4_;
            auVar90._12_4_ = auVar49._12_4_ * auVar50._12_4_;
            auVar50 = vfmsub231ps_fma(auVar90,auVar70,auVar98);
            auVar91._0_4_ = fVar101 * auVar50._0_4_;
            auVar91._4_4_ = fVar101 * auVar50._4_4_;
            auVar91._8_4_ = fVar101 * auVar50._8_4_;
            auVar91._12_4_ = fVar101 * auVar50._12_4_;
            auVar50 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar72);
            local_1098 = vfmadd231ps_avx512vl(auVar50,auVar92,auVar73);
            auVar99._0_4_ = auVar53._0_4_ + auVar51._0_4_;
            auVar99._4_4_ = auVar53._4_4_ + auVar51._4_4_;
            auVar99._8_4_ = auVar53._8_4_ + auVar51._8_4_;
            auVar99._12_4_ = auVar53._12_4_ + auVar51._12_4_;
            auVar50 = vaddps_avx512vl(auVar60,auVar59);
            auVar72 = vaddps_avx512vl(auVar52,auVar61);
            auVar73 = vmulps_avx512vl(auVar50,auVar64);
            auVar73 = vfmsub231ps_avx512vl(auVar73,auVar66,auVar72);
            auVar72 = vmulps_avx512vl(auVar72,auVar63);
            auVar72 = vfmsub231ps_avx512vl(auVar72,auVar64,auVar99);
            auVar74 = vmulps_avx512vl(auVar99,auVar66);
            auVar50 = vfmsub231ps_avx512vl(auVar74,auVar63,auVar50);
            auVar100._0_4_ = fVar101 * auVar50._0_4_;
            auVar100._4_4_ = fVar101 * auVar50._4_4_;
            auVar100._8_4_ = fVar101 * auVar50._8_4_;
            auVar100._12_4_ = fVar101 * auVar50._12_4_;
            auVar50 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar72);
            local_1088 = vfmadd231ps_avx512vl(auVar50,auVar92,auVar73);
            auVar53 = vaddps_avx512vl(auVar53,auVar69);
            auVar58 = vaddps_avx512vl(auVar59,auVar58);
            auVar50 = vaddps_avx512vl(auVar61,auVar71);
            auVar59 = vmulps_avx512vl(auVar58,auVar68);
            auVar59 = vfmsub231ps_avx512vl(auVar59,auVar67,auVar50);
            auVar50 = vmulps_avx512vl(auVar50,auVar65);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar68,auVar53);
            auVar114._0_4_ = auVar53._0_4_ * auVar67._0_4_;
            auVar114._4_4_ = auVar53._4_4_ * auVar67._4_4_;
            auVar114._8_4_ = auVar53._8_4_ * auVar67._8_4_;
            auVar114._12_4_ = auVar53._12_4_ * auVar67._12_4_;
            auVar53 = vfmsub231ps_fma(auVar114,auVar65,auVar58);
            auVar53 = vmulps_avx512vl(auVar104,auVar53);
            auVar53 = vfmadd231ps_avx512vl(auVar53,auVar95,auVar50);
            auVar53 = vfmadd231ps_avx512vl(auVar53,auVar92,auVar59);
            auVar112._0_4_ = local_1088._0_4_ + local_1098._0_4_;
            auVar112._4_4_ = local_1088._4_4_ + local_1098._4_4_;
            auVar112._8_4_ = local_1088._8_4_ + local_1098._8_4_;
            auVar112._12_4_ = local_1088._12_4_ + local_1098._12_4_;
            local_1078 = vaddps_avx512vl(auVar53,auVar112);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar58 = vandps_avx512vl(local_1078,auVar19);
            auVar20._8_4_ = 0x34000000;
            auVar20._0_8_ = 0x3400000034000000;
            auVar20._12_4_ = 0x34000000;
            auVar50 = vmulps_avx512vl(auVar58,auVar20);
            auVar59 = vminps_avx512vl(local_1098,local_1088);
            auVar59 = vminps_avx512vl(auVar59,auVar53);
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar61 = vxorps_avx512vl(auVar50,auVar21);
            uVar15 = vcmpps_avx512vl(auVar59,auVar61,5);
            auVar59 = vmaxps_avx512vl(local_1098,local_1088);
            auVar53 = vmaxps_avx512vl(auVar59,auVar53);
            uVar16 = vcmpps_avx512vl(auVar53,auVar50,2);
            bVar40 = ((byte)uVar15 | (byte)uVar16) & 0xf;
            pSVar39 = local_1190;
            context = local_1198;
            if (bVar40 != 0) {
              auVar53 = vmulps_avx512vl(auVar62,auVar66);
              auVar50 = vmulps_avx512vl(auVar70,auVar64);
              auVar59 = vmulps_avx512vl(auVar49,auVar63);
              auVar61 = vmulps_avx512vl(auVar64,auVar67);
              auVar71 = vmulps_avx512vl(auVar63,auVar68);
              auVar69 = vmulps_avx512vl(auVar66,auVar65);
              auVar49 = vfmsub213ps_avx512vl(auVar49,auVar64,auVar53);
              auVar62 = vfmsub213ps_avx512vl(auVar62,auVar63,auVar50);
              auVar70 = vfmsub213ps_avx512vl(auVar70,auVar66,auVar59);
              auVar66 = vfmsub213ps_avx512vl(auVar68,auVar66,auVar61);
              auVar64 = vfmsub213ps_avx512vl(auVar65,auVar64,auVar71);
              auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar69);
              auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar53 = vandps_avx512vl(auVar53,auVar65);
              auVar61 = vandps_avx512vl(auVar61,auVar65);
              uVar31 = vcmpps_avx512vl(auVar53,auVar61,1);
              auVar53 = vandps_avx512vl(auVar50,auVar65);
              auVar50 = vandps_avx512vl(auVar71,auVar65);
              uVar34 = vcmpps_avx512vl(auVar53,auVar50,1);
              auVar53 = vandps_avx512vl(auVar59,auVar65);
              auVar50 = vandps_avx512vl(auVar69,auVar65);
              uVar35 = vcmpps_avx512vl(auVar53,auVar50,1);
              bVar7 = (bool)((byte)uVar31 & 1);
              local_1028._0_4_ = (uint)bVar7 * auVar49._0_4_ | (uint)!bVar7 * auVar66._0_4_;
              bVar7 = (bool)((byte)(uVar31 >> 1) & 1);
              local_1028._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar66._4_4_;
              bVar7 = (bool)((byte)(uVar31 >> 2) & 1);
              local_1028._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar66._8_4_;
              bVar7 = (bool)((byte)(uVar31 >> 3) & 1);
              local_1028._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar66._12_4_;
              bVar7 = (bool)((byte)uVar34 & 1);
              local_1018._0_4_ = (uint)bVar7 * auVar62._0_4_ | (uint)!bVar7 * auVar64._0_4_;
              bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
              local_1018._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * auVar64._4_4_;
              bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
              local_1018._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * auVar64._8_4_;
              bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
              local_1018._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * auVar64._12_4_;
              bVar7 = (bool)((byte)uVar35 & 1);
              local_1008[0] = (float)((uint)bVar7 * auVar70._0_4_ | (uint)!bVar7 * auVar63._0_4_);
              bVar7 = (bool)((byte)(uVar35 >> 1) & 1);
              local_1008[1] = (float)((uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * auVar63._4_4_);
              bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
              local_1008[2] = (float)((uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * auVar63._8_4_);
              bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
              local_1008[3] = (float)((uint)bVar7 * auVar70._12_4_ | (uint)!bVar7 * auVar63._12_4_);
              auVar105._0_4_ = fVar101 * local_1008[0];
              auVar105._4_4_ = fVar101 * local_1008[1];
              auVar105._8_4_ = fVar101 * local_1008[2];
              auVar105._12_4_ = fVar101 * local_1008[3];
              auVar53 = vfmadd213ps_fma(auVar95,local_1018,auVar105);
              auVar53 = vfmadd213ps_fma(auVar92,local_1028,auVar53);
              auVar93._0_4_ = auVar53._0_4_ + auVar53._0_4_;
              auVar93._4_4_ = auVar53._4_4_ + auVar53._4_4_;
              auVar93._8_4_ = auVar53._8_4_ + auVar53._8_4_;
              auVar93._12_4_ = auVar53._12_4_ + auVar53._12_4_;
              auVar96._0_4_ = auVar52._0_4_ * local_1008[0];
              auVar96._4_4_ = auVar52._4_4_ * local_1008[1];
              auVar96._8_4_ = auVar52._8_4_ * local_1008[2];
              auVar96._12_4_ = auVar52._12_4_ * local_1008[3];
              auVar52 = vfmadd213ps_fma(auVar60,local_1018,auVar96);
              auVar52 = vfmadd213ps_fma(auVar51,local_1028,auVar52);
              auVar51 = vrcp14ps_avx512vl(auVar93);
              auVar49 = auVar117._0_16_;
              auVar53 = vfnmadd213ps_avx512vl(auVar51,auVar93,auVar49);
              auVar51 = vfmadd132ps_fma(auVar53,auVar51,auVar51);
              local_1038._0_4_ = (auVar52._0_4_ + auVar52._0_4_) * auVar51._0_4_;
              local_1038._4_4_ = (auVar52._4_4_ + auVar52._4_4_) * auVar51._4_4_;
              local_1038._8_4_ = (auVar52._8_4_ + auVar52._8_4_) * auVar51._8_4_;
              local_1038._12_4_ = (auVar52._12_4_ + auVar52._12_4_) * auVar51._12_4_;
              auVar84 = ZEXT1664(local_1038);
              uVar86 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar22._4_4_ = uVar86;
              auVar22._0_4_ = uVar86;
              auVar22._8_4_ = uVar86;
              auVar22._12_4_ = uVar86;
              uVar15 = vcmpps_avx512vl(local_1038,auVar22,0xd);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar51 = vxorps_avx512vl(auVar93,auVar23);
              fVar101 = (ray->super_RayK<1>).tfar;
              auVar24._4_4_ = fVar101;
              auVar24._0_4_ = fVar101;
              auVar24._8_4_ = fVar101;
              auVar24._12_4_ = fVar101;
              uVar16 = vcmpps_avx512vl(local_1038,auVar24,2);
              uVar17 = vcmpps_avx512vl(auVar93,auVar51,4);
              bVar40 = (byte)uVar15 & (byte)uVar16 & (byte)uVar17 & bVar40;
              if (bVar40 != 0) {
                auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                auVar4._4_4_ = (ray->super_RayK<1>).mask;
                auVar4._8_4_ = (ray->super_RayK<1>).id;
                auVar4._12_4_ = (ray->super_RayK<1>).flags;
                auVar85 = ZEXT1664(auVar4);
                uVar33 = vextractps_avx(auVar4,1);
                local_1068 = &local_11b9;
                local_1060 = bVar40;
                auVar25._8_4_ = 0x219392ef;
                auVar25._0_8_ = 0x219392ef219392ef;
                auVar25._12_4_ = 0x219392ef;
                uVar31 = vcmpps_avx512vl(auVar58,auVar25,5);
                auVar51 = vrcp14ps_avx512vl(local_1078);
                auVar52 = vfnmadd213ps_avx512vl(local_1078,auVar51,auVar49);
                auVar51 = vfmadd132ps_avx512vl(auVar52,auVar51,auVar51);
                fVar101 = (float)((uint)((byte)uVar31 & 1) * auVar51._0_4_);
                fVar102 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar51._4_4_);
                fVar88 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar51._8_4_);
                fVar103 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar51._12_4_);
                auVar80._0_4_ = fVar101 * local_1098._0_4_;
                auVar80._4_4_ = fVar102 * local_1098._4_4_;
                auVar80._8_4_ = fVar88 * local_1098._8_4_;
                auVar80._12_4_ = fVar103 * local_1098._12_4_;
                local_1058 = vminps_avx512vl(auVar80,auVar49);
                auVar81._0_4_ = fVar101 * local_1088._0_4_;
                auVar81._4_4_ = fVar102 * local_1088._4_4_;
                auVar81._8_4_ = fVar88 * local_1088._8_4_;
                auVar81._12_4_ = fVar103 * local_1088._12_4_;
                local_1048 = vminps_avx512vl(auVar81,auVar49);
                auVar82._8_4_ = 0x7f800000;
                auVar82._0_8_ = 0x7f8000007f800000;
                auVar82._12_4_ = 0x7f800000;
                auVar51 = vblendmps_avx512vl(auVar82,local_1038);
                auVar75._0_4_ =
                     (uint)(bVar40 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar40 & 1) * 0x7f800000;
                bVar7 = (bool)(bVar40 >> 1 & 1);
                auVar75._4_4_ = (uint)bVar7 * auVar51._4_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(bVar40 >> 2 & 1);
                auVar75._8_4_ = (uint)bVar7 * auVar51._8_4_ | (uint)!bVar7 * 0x7f800000;
                auVar75._12_4_ =
                     (uint)(bVar40 >> 3) * auVar51._12_4_ | (uint)!(bool)(bVar40 >> 3) * 0x7f800000;
                auVar51 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar51 = vminps_avx(auVar51,auVar75);
                auVar52 = vshufpd_avx(auVar51,auVar51,1);
                auVar51 = vminps_avx(auVar52,auVar51);
                uVar15 = vcmpps_avx512vl(auVar75,auVar51,0);
                bVar29 = (byte)uVar15 & bVar40;
                do {
                  auVar51 = auVar116._0_16_;
                  bVar28 = bVar40;
                  if (bVar29 != 0) {
                    bVar28 = bVar29;
                  }
                  uVar44 = 0;
                  for (uVar30 = (uint)bVar28; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000)
                  {
                    uVar44 = uVar44 + 1;
                  }
                  local_11a8 = (ulong)uVar44;
                  local_10f0 = *(uint *)((long)&local_f88 + local_11a8 * 4);
                  local_1188 = (pSVar39->geometries).items[local_10f0].ptr;
                  if ((local_1188->mask & uVar33) == 0) {
                    bVar40 = ~(byte)(1 << (uVar44 & 0x1f)) & bVar40;
                  }
                  else {
                    local_11b0 = context->args;
                    auVar52 = auVar85._0_16_;
                    if (local_11b0->filter == (RTCFilterFunctionN)0x0) {
                      local_1138.context = context->user;
                      if (local_1188->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar31 = (ulong)(uVar44 << 2);
                        fVar101 = *(float *)(local_1058 + uVar31);
                        fVar102 = *(float *)(local_1048 + uVar31);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar31);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + uVar31);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + uVar31);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_1008 + uVar31);
                        ray->u = fVar101;
                        ray->v = fVar102;
                        ray->primID = *(uint *)((long)&local_10a8 + uVar31);
                        ray->geomID = local_10f0;
                        ray->instID[0] = (local_1138.context)->instID[0];
                        ray->instPrimID[0] = (local_1138.context)->instPrimID[0];
                        break;
                      }
                      local_1178 = auVar52;
                    }
                    else {
                      local_1178 = auVar52;
                      local_1138.context = context->user;
                    }
                    uVar31 = (ulong)(uVar44 * 4);
                    local_1108 = *(float *)(local_1028 + uVar31);
                    local_1104 = *(undefined4 *)(local_1018 + uVar31);
                    local_1100 = *(undefined4 *)((long)local_1008 + uVar31);
                    local_10fc = *(undefined4 *)(local_1058 + uVar31);
                    local_10f8 = *(undefined4 *)(local_1048 + uVar31);
                    local_10f4 = *(undefined4 *)((long)&local_10a8 + uVar31);
                    local_10ec = (local_1138.context)->instID[0];
                    local_10e8 = (local_1138.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar31);
                    local_117c = -1;
                    local_1138.valid = &local_117c;
                    local_1138.geometryUserPtr = local_1188->userPtr;
                    local_1138.ray = (RTCRayN *)ray;
                    local_1138.hit = (RTCHitN *)&local_1108;
                    local_1138.N = 1;
                    local_1168 = auVar84._0_16_;
                    local_11a0 = CONCAT44(local_11a0._4_4_,(uint)bVar40);
                    local_1178 = auVar52;
                    if (local_1188->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ea9073:
                      auVar51 = auVar116._0_16_;
                      if ((local_11b0->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_11b0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_1188->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_11b0->filter)(&local_1138);
                        uVar44 = (uint)local_11a8;
                        bVar40 = (byte)local_11a0;
                        auVar84 = ZEXT1664(local_1168);
                        auVar120 = ZEXT1664(local_10d8);
                        auVar119 = ZEXT1664(local_10c8);
                        auVar118 = ZEXT1664(local_10b8);
                        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar117 = ZEXT1664(auVar52);
                        auVar51 = vxorps_avx512vl(auVar51,auVar51);
                        auVar116 = ZEXT1664(auVar51);
                        pSVar39 = local_1190;
                        context = local_1198;
                        if (*local_1138.valid == 0) goto LAB_01ea914a;
                      }
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1138.hit;
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1138.hit + 4);
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1138.hit + 8);
                      *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                      *(float *)((long)local_1138.ray + 0x40) = *(float *)(local_1138.hit + 0x10);
                      *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                      *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                      *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                      *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                    }
                    else {
                      (*local_1188->intersectionFilterN)(&local_1138);
                      uVar44 = (uint)local_11a8;
                      bVar40 = (byte)local_11a0;
                      auVar84 = ZEXT1664(local_1168);
                      auVar120 = ZEXT1664(local_10d8);
                      auVar119 = ZEXT1664(local_10c8);
                      auVar118 = ZEXT1664(local_10b8);
                      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar117 = ZEXT1664(auVar52);
                      auVar51 = vxorps_avx512vl(auVar51,auVar51);
                      auVar116 = ZEXT1664(auVar51);
                      pSVar39 = local_1190;
                      context = local_1198;
                      if (*local_1138.valid != 0) goto LAB_01ea9073;
LAB_01ea914a:
                      (ray->super_RayK<1>).tfar = (float)local_1178._0_4_;
                      pSVar39 = local_1190;
                      context = local_1198;
                    }
                    auVar5._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar5._4_4_ = (ray->super_RayK<1>).mask;
                    auVar5._8_4_ = (ray->super_RayK<1>).id;
                    auVar5._12_4_ = (ray->super_RayK<1>).flags;
                    auVar85 = ZEXT1664(auVar5);
                    fVar101 = (ray->super_RayK<1>).tfar;
                    auVar26._4_4_ = fVar101;
                    auVar26._0_4_ = fVar101;
                    auVar26._8_4_ = fVar101;
                    auVar26._12_4_ = fVar101;
                    uVar15 = vcmpps_avx512vl(auVar84._0_16_,auVar26,2);
                    bVar40 = ~(byte)(1 << (uVar44 & 0x1f)) & bVar40 & (byte)uVar15;
                    uVar33 = vextractps_avx(auVar5,1);
                  }
                  if (bVar40 == 0) break;
                  auVar83._8_4_ = 0x7f800000;
                  auVar83._0_8_ = 0x7f8000007f800000;
                  auVar83._12_4_ = 0x7f800000;
                  auVar51 = vblendmps_avx512vl(auVar83,auVar84._0_16_);
                  auVar76._0_4_ =
                       (uint)(bVar40 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar40 & 1) * 0x7f800000;
                  bVar7 = (bool)(bVar40 >> 1 & 1);
                  auVar76._4_4_ = (uint)bVar7 * auVar51._4_4_ | (uint)!bVar7 * 0x7f800000;
                  bVar7 = (bool)(bVar40 >> 2 & 1);
                  auVar76._8_4_ = (uint)bVar7 * auVar51._8_4_ | (uint)!bVar7 * 0x7f800000;
                  bVar7 = (bool)(bVar40 >> 3 & 1);
                  auVar76._12_4_ = (uint)bVar7 * auVar51._12_4_ | (uint)!bVar7 * 0x7f800000;
                  auVar51 = vshufps_avx(auVar76,auVar76,0xb1);
                  auVar51 = vminps_avx(auVar51,auVar76);
                  auVar52 = vshufpd_avx(auVar51,auVar51,1);
                  auVar51 = vminps_avx(auVar52,auVar51);
                  uVar15 = vcmpps_avx512vl(auVar76,auVar51,0);
                  bVar29 = (byte)uVar15 & bVar40;
                } while( true );
              }
            }
            local_1140 = local_1140 + 1;
          } while (local_1140 != local_1148);
        }
        fVar101 = (ray->super_RayK<1>).tfar;
        auVar84 = ZEXT1664(CONCAT412(fVar101,CONCAT48(fVar101,CONCAT44(fVar101,fVar101))));
        auVar85 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar106 = ZEXT1664(local_fa8);
        auVar107 = ZEXT1664(local_fb8);
        auVar111 = ZEXT1664(local_fd8);
        auVar113 = ZEXT1664(local_fe8);
        auVar115 = ZEXT1664(local_ff8);
        lVar41 = local_11b8;
        lVar32 = local_1150;
        lVar46 = local_1158;
        fVar101 = local_f98;
        fVar102 = fStack_f94;
        fVar103 = fStack_f90;
        fVar88 = fStack_f8c;
        fVar108 = local_fc8;
        fVar109 = fStack_fc4;
        fVar110 = fStack_fc0;
        fVar77 = fStack_fbc;
      }
    } while (puVar27 != &local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }